

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

uint_t flexfloat_get_bits(flexfloat_t *a)

{
  _Bool _Var1;
  flexfloat_t *in_RDI;
  uint_t frac;
  int_fast16_t exp;
  uint_t local_18;
  long local_10;
  
  local_10 = flexfloat_exp(in_RDI);
  local_18 = flexfloat_frac(in_RDI);
  if (local_10 == 0x7ff) {
    local_10 = flexfloat_inf_exp(in_RDI->desc);
  }
  else if (local_10 < 1) {
    local_18 = flexfloat_denorm_frac(in_RDI,local_10);
    local_10 = 0;
  }
  _Var1 = flexfloat_sign(in_RDI);
  return ((ulong)_Var1 << ((in_RDI->desc).exp_bits + (in_RDI->desc).frac_bits & 0x3f)) +
         (local_10 << ((in_RDI->desc).frac_bits & 0x3f)) + local_18;
}

Assistant:

uint_t flexfloat_get_bits(flexfloat_t *a)
{
    int_fast16_t exp = flexfloat_exp(a);
    uint_t frac = flexfloat_frac(a);

    if(exp == INF_EXP)
        exp = flexfloat_inf_exp(a->desc);
    else if(exp <= 0) {
        frac = flexfloat_denorm_frac(a, exp);
        exp = 0;
    }

    return ((uint_t)flexfloat_sign(a) << (a->desc.exp_bits + a->desc.frac_bits))
           + ((uint_t)exp << a->desc.frac_bits)
           + frac;
}